

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O0

Vec_Int_t * Gia_AigerReadPacking(uchar **ppPos,int nSize)

{
  int Entry;
  Vec_Int_t *p;
  int local_24;
  int i;
  Vec_Int_t *vPacking;
  int nSize_local;
  uchar **ppPos_local;
  
  p = Vec_IntAlloc(nSize / 4);
  if (nSize % 4 == 0) {
    local_24 = 0;
    while (local_24 < nSize / 4) {
      Entry = Gia_AigerReadInt(*ppPos);
      Vec_IntPush(p,Entry);
      local_24 = local_24 + 1;
      *ppPos = *ppPos + 4;
    }
    return p;
  }
  __assert_fail("nSize % 4 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAigerExt.c"
                ,0x132,"Vec_Int_t *Gia_AigerReadPacking(unsigned char **, int)");
}

Assistant:

Vec_Int_t * Gia_AigerReadPacking( unsigned char ** ppPos, int nSize )
{
    Vec_Int_t * vPacking = Vec_IntAlloc( nSize/4 );
    int i;
    assert( nSize % 4 == 0 );
    for ( i = 0; i < nSize/4; i++, *ppPos += 4 )
        Vec_IntPush( vPacking, Gia_AigerReadInt( *ppPos ) );
    return vPacking;
}